

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.c
# Opt level: O1

void * priority_queue_poll(priority_queue_t *queue)

{
  void *pvVar1;
  int iVar2;
  char *fmt;
  size_t sVar3;
  long ln;
  err_lvl_t lvl;
  void *pvVar4;
  ulong uVar5;
  
  if (queue->size == 0) {
    fmt = "Trying to poll from empty queue\n";
    ln = 0x4c;
    lvl = ERR_WARN;
  }
  else {
    pvVar1 = queue->max_element;
    if (pvVar1 != (void *)0x0) {
      if (queue->alloc_size != 0) {
        sVar3 = 0;
        do {
          if (queue->pointers[sVar3] == pvVar1) {
            queue->pointers[sVar3] = (void *)0x0;
            break;
          }
          sVar3 = sVar3 + 1;
        } while (queue->alloc_size != sVar3);
      }
      queue->max_element = (void *)0x0;
      if (queue->alloc_size != 0) {
        uVar5 = 0;
        do {
          pvVar4 = queue->pointers[uVar5];
          if (pvVar4 != (void *)0x0) {
            if (queue->max_element != (void *)0x0) {
              iVar2 = (*queue->compare)(pvVar4,queue->max_element);
              if (-1 < iVar2) goto LAB_00113c84;
              pvVar4 = queue->pointers[uVar5];
            }
            queue->max_element = pvVar4;
          }
LAB_00113c84:
          uVar5 = uVar5 + 1;
        } while (uVar5 < queue->alloc_size);
      }
      queue->size = queue->size - 1;
      return pvVar1;
    }
    fmt = "Trying to poll from queue and max element is undefined\n";
    ln = 0x50;
    lvl = ERR_ERROR;
  }
  err_msg(lvl,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/priority_queue.c"
          ,ln,fmt);
  return (void *)0x0;
}

Assistant:

void* priority_queue_poll(priority_queue_t *queue)
{
    
    size_t i;
    void *res;

    if (queue->size == 0) {
        E_WARN("Trying to poll from empty queue\n");
        return NULL;
    }
    if (queue->max_element == NULL) {
        E_ERROR("Trying to poll from queue and max element is undefined\n");
        return NULL;
    }
    res = queue->max_element;
    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] == queue->max_element) {
            queue->pointers[i] = NULL;
            break;
        }
    }
    queue->max_element = NULL;
    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] == 0)
            continue;
        if (queue->max_element == NULL) {
            queue->max_element = queue->pointers[i];
        } else {
            if (queue->compare(queue->pointers[i], queue->max_element) < 0)
                queue->max_element = queue->pointers[i];
        }
    }
    queue->size--;
    return res;
}